

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O1

geto_result_type * __thiscall
pstore::http::
buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>_>
::geto(geto_result_type *__return_storage_ptr__,
      buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
      *this,int io)

{
  uint8_t result;
  anon_class_1_0_00000001 local_42;
  element_type local_41;
  error_or_n<int,_gsl::span<typename_span<unsigned_char,__1L>::element_type>_> local_40;
  span<unsigned_char,__1L> local_20;
  
  local_20.storage_.data_ = &local_41;
  local_41 = '\0';
  local_20.storage_.super_extent_type<_1L>.size_ = 1;
  buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(int,pstore::gsl::span<unsigned_char,-1l>const&)>>
  ::get_span<pstore::gsl::span<unsigned_char,_1l>>
            (&local_40,
             (buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>>
              *)this,io,&local_20);
  pstore::operator>>=(__return_storage_ptr__,&local_40,&local_42);
  if (local_40.has_error_ == false) {
    error_or<std::tuple<int,pstore::gsl::span<unsigned_char,-1l>>>::
    value_storage_impl<pstore::error_or<std::tuple<int,pstore::gsl::span<unsigned_char,_1l>>>&,std::tuple<int,pstore::gsl::span<unsigned_char,_1l>>>
              (&local_40);
  }
  else {
    error_or<std::tuple<int,pstore::gsl::span<unsigned_char,-1l>>>::
    error_storage_impl<pstore::error_or<std::tuple<int,pstore::gsl::span<unsigned_char,_1l>>>&,std::error_code>
              (&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

auto buffered_reader<IO, RefillFunction>::geto (IO io) -> geto_result_type {
            std::uint8_t result{};
            return get_span (io, gsl::make_span (&result, 1)) >>= [] (IO io2,
                                                                      byte_span const & sp) {
                return geto_result_type{in_place, io2,
                                        sp.size () == 1 ? just (sp[0]) : nothing<std::uint8_t> ()};
            };
        }